

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestSpecParser::visitChar(TestSpecParser *this,char c)

{
  Mode MVar1;
  bool bVar2;
  size_t sVar3;
  string sStack_38;
  
  MVar1 = this->m_mode;
  if (MVar1 == Name) {
LAB_001427ec:
    if (c != '[') {
      if (c != ',') {
        return;
      }
      addPattern<Catch::TestSpec::NamePattern>(this);
      addFilter(this);
      return;
    }
    subString_abi_cxx11_(&sStack_38,this);
    bVar2 = std::operator==(&sStack_38,"exclude:");
    std::__cxx11::string::~string((string *)&sStack_38);
    if (bVar2) {
      this->m_exclusion = true;
    }
    else {
      addPattern<Catch::TestSpec::NamePattern>(this);
    }
  }
  else {
    if (MVar1 != None) {
      if (c == '\"' && MVar1 == QuotedName) {
        addPattern<Catch::TestSpec::NamePattern>(this);
        return;
      }
      if (c != ']' || MVar1 != Tag) {
        return;
      }
      addPattern<Catch::TestSpec::TagPattern>(this);
      return;
    }
    if (c == ' ') {
      return;
    }
    if (c == '\"') {
      sVar3 = this->m_pos + 1;
      this->m_pos = sVar3;
      this->m_mode = QuotedName;
      goto LAB_00142859;
    }
    if (c != '[') {
      if (c == '~') {
        this->m_exclusion = true;
        return;
      }
      this->m_mode = Name;
      this->m_start = this->m_pos;
      goto LAB_001427ec;
    }
  }
  sVar3 = this->m_pos + 1;
  this->m_pos = sVar3;
  this->m_mode = Tag;
LAB_00142859:
  this->m_start = sVar3;
  return;
}

Assistant:

void visitChar( char c ) {
            if( m_mode == None ) {
                switch( c ) {
                case ' ': return;
                case '~': m_exclusion = true; return;
                case '[': return startNewMode( Tag, ++m_pos );
                case '"': return startNewMode( QuotedName, ++m_pos );
                default: startNewMode( Name, m_pos ); break;
                }
            }
            if( m_mode == Name ) {
                if( c == ',' ) {
                    addPattern<TestSpec::NamePattern>();
                    addFilter();
                }
                else if( c == '[' ) {
                    if( subString() == "exclude:" )
                        m_exclusion = true;
                    else
                        addPattern<TestSpec::NamePattern>();
                    startNewMode( Tag, ++m_pos );
                }
            }
            else if( m_mode == QuotedName && c == '"' )
                addPattern<TestSpec::NamePattern>();
            else if( m_mode == Tag && c == ']' )
                addPattern<TestSpec::TagPattern>();
        }